

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O1

bool __thiscall IceCore::Container::DeleteKeepingOrder(Container *this,udword entry)

{
  uint uVar1;
  udword *puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar1 = this->mCurNbEntries;
  bVar6 = uVar1 != 0;
  if (bVar6) {
    puVar2 = this->mEntries;
    uVar4 = 0;
    if (*puVar2 != entry) {
      uVar5 = 0;
      do {
        if (uVar1 - 1 == (int)uVar5) {
          return false;
        }
        uVar4 = uVar5 + 1;
        lVar3 = uVar5 + 1;
        uVar5 = uVar4;
      } while (puVar2[lVar3] != entry);
      bVar6 = (uint)uVar4 < uVar1;
    }
    this->mCurNbEntries = uVar1 - 1;
    if ((uint)uVar4 < uVar1 - 1) {
      uVar4 = uVar4 & 0xffffffff;
      do {
        puVar2[uVar4] = puVar2[uVar4 + 1];
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->mCurNbEntries);
    }
  }
  return bVar6;
}

Assistant:

bool Container::DeleteKeepingOrder(udword entry)
{
	// Look for the entry
	for(udword i=0;i<mCurNbEntries;i++)
	{
		if(mEntries[i]==entry)
		{
			// Entry has been found at index i.
			// Shift entries to preserve order. You really should use a linked list instead.
			mCurNbEntries--;
			for(udword j=i;j<mCurNbEntries;j++)
			{
				mEntries[j] = mEntries[j+1];
			}
			return true;
		}
	}
	return false;
}